

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

TokenStrings * __thiscall
gl4cts::SparseTexture2CommitmentTestCase::createShaderTokens
          (TokenStrings *__return_storage_ptr__,SparseTexture2CommitmentTestCase *this,GLint target,
          GLint format,GLint sample,string *outputBase,string *inputBase)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  char *pcVar6;
  long *plVar7;
  size_type *psVar8;
  string *psVar9;
  string prefix;
  ostringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string *local_218;
  string *local_210;
  string *local_208;
  GLint local_1fc;
  string local_1f8;
  GLint local_1d4;
  string *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8 [2];
  size_type local_1b8 [2];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  (__return_storage_ptr__->format)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->format).field_2;
  (__return_storage_ptr__->format)._M_string_length = 0;
  (__return_storage_ptr__->format).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->pointType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pointType).field_2;
  (__return_storage_ptr__->pointType)._M_string_length = 0;
  (__return_storage_ptr__->pointType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->pointDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pointDef).field_2;
  (__return_storage_ptr__->pointDef)._M_string_length = 0;
  (__return_storage_ptr__->pointDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->outputType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->outputType).field_2;
  (__return_storage_ptr__->outputType)._M_string_length = 0;
  (__return_storage_ptr__->outputType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->inputType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->inputType).field_2;
  (__return_storage_ptr__->inputType)._M_string_length = 0;
  (__return_storage_ptr__->inputType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->returnType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->returnType).field_2;
  (__return_storage_ptr__->returnType)._M_string_length = 0;
  (__return_storage_ptr__->returnType).field_2._M_local_buf[0] = '\0';
  psVar1 = &__return_storage_ptr__->resultExpected;
  (__return_storage_ptr__->resultExpected)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->resultExpected).field_2;
  (__return_storage_ptr__->resultExpected)._M_string_length = 0;
  (__return_storage_ptr__->resultExpected).field_2._M_local_buf[0] = '\0';
  psVar9 = &__return_storage_ptr__->resultDefault;
  (__return_storage_ptr__->resultDefault)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->resultDefault).field_2;
  psVar8 = &(__return_storage_ptr__->resultDefault)._M_string_length;
  (__return_storage_ptr__->resultDefault)._M_string_length = 0;
  (__return_storage_ptr__->resultDefault).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->epsilon)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->epsilon).field_2;
  (__return_storage_ptr__->epsilon)._M_string_length = 0;
  (__return_storage_ptr__->epsilon).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->sampleDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->sampleDef).field_2;
  (__return_storage_ptr__->sampleDef)._M_string_length = 0;
  (__return_storage_ptr__->sampleDef).field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1fc = sample;
  local_1d4 = target;
  if (0x8813 < format) {
    if (format < 0x8d8e) {
      if (0x8d75 < format) {
        if (format < 0x8d82) {
          if (format == 0x8d76) {
            pcVar6 = "rgba16ui";
          }
          else {
            if (format != 0x8d7c) goto switchD_00a6243a_caseD_8f96;
            pcVar6 = "rgba8ui";
          }
LAB_00a62580:
          std::__cxx11::string::_M_replace
                    ((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
          std::__cxx11::string::_M_replace
                    ((ulong)psVar1,0,
                     (char *)(__return_storage_ptr__->resultExpected)._M_string_length,0x1c8b9a0);
          pcVar6 = "(0, 0, 0, 0)";
          goto LAB_00a627a2;
        }
        if (format == 0x8d82) {
          pcVar6 = "rgba32i";
        }
        else {
          if (format != 0x8d88) goto switchD_00a6243a_caseD_8f96;
          pcVar6 = "rgba16i";
        }
LAB_00a628a8:
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)(__return_storage_ptr__->resultExpected)._M_string_length
                   ,0x1c8b9a0);
        pcVar6 = "(0, 0, 0, 0)";
        goto LAB_00a628d9;
      }
      if (format == 0x8814) {
        pcVar6 = "rgba32f";
        goto LAB_00a62819;
      }
      if (format == 0x881a) {
        pcVar6 = "rgba16f";
        goto LAB_00a62819;
      }
      if (format != 0x8c3a) goto switchD_00a6243a_caseD_8f96;
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1a71cf9);
      pcVar6 = "(1, 1, 1, 1)";
      goto LAB_00a62878;
    }
    switch(format) {
    case 0x8f94:
      pcVar6 = "r8_snorm";
      goto LAB_00a62862;
    case 0x8f95:
      pcVar6 = "rg8_snorm";
      goto LAB_00a627f1;
    case 0x8f96:
    case 0x8f9a:
      break;
    case 0x8f97:
      pcVar6 = "rgba8_snorm";
      goto LAB_00a62819;
    case 0x8f98:
      pcVar6 = "r16_snorm";
      goto LAB_00a62862;
    case 0x8f99:
      pcVar6 = "rg16_snorm";
      goto LAB_00a627f1;
    case 0x8f9b:
      pcVar6 = "rgba16_snorm";
LAB_00a62819:
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
      pcVar6 = "(1, 1, 1, 1)";
LAB_00a6282f:
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(__return_storage_ptr__->resultExpected)._M_string_length,
                 (ulong)pcVar6);
      pcVar6 = "(0, 0, 0, 0)";
      goto LAB_00a62902;
    default:
      if (format == 0x8d8e) {
        pcVar6 = "rgba8i";
        goto LAB_00a628a8;
      }
      if (format == 0x906f) {
        pcVar6 = "rgb10_a2ui";
        goto LAB_00a62580;
      }
    }
    goto switchD_00a6243a_caseD_8f96;
  }
  if (format < 0x81a5) {
    if (format == 0x8058) {
      pcVar6 = "rgba8";
    }
    else if (format == 0x8059) {
      pcVar6 = "rgb10_a2";
    }
    else {
      if (format != 0x805b) goto switchD_00a6243a_caseD_8f96;
      pcVar6 = "rgba16";
    }
    goto LAB_00a62819;
  }
  switch(format) {
  case 0x8229:
    pcVar6 = "r8";
    break;
  case 0x822a:
    pcVar6 = "r16";
    break;
  case 0x822b:
    pcVar6 = "rg8";
    goto LAB_00a627f1;
  case 0x822c:
    pcVar6 = "rg16";
    goto LAB_00a627f1;
  case 0x822d:
    pcVar6 = "r16f";
    break;
  case 0x822e:
    pcVar6 = "r32f";
    break;
  case 0x822f:
    pcVar6 = "rg16f";
    goto LAB_00a627f1;
  case 0x8230:
    pcVar6 = "rg32f";
LAB_00a627f1:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    pcVar6 = "(1, 1, 0, 1)";
    goto LAB_00a62878;
  case 0x8231:
    pcVar6 = "r8i";
    goto LAB_00a6272b;
  case 0x8232:
    pcVar6 = "r8ui";
    goto LAB_00a626c5;
  case 0x8233:
    pcVar6 = "r16i";
    goto LAB_00a6272b;
  case 0x8234:
    pcVar6 = "r16ui";
    goto LAB_00a626c5;
  case 0x8235:
    pcVar6 = "r32i";
LAB_00a6272b:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    pcVar6 = "(1, 0, 0, 1)";
LAB_00a62741:
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(__return_storage_ptr__->resultExpected)._M_string_length,
               (ulong)pcVar6);
    pcVar6 = "(0, 0, 0, 1)";
LAB_00a628d9:
    std::__cxx11::string::_M_replace((ulong)psVar9,0,(char *)*psVar8,(ulong)pcVar6);
    pcVar6 = "i";
LAB_00a628fa:
    psVar9 = &local_1f8;
    psVar8 = &local_1f8._M_string_length;
    goto LAB_00a62902;
  case 0x8236:
    pcVar6 = "r32ui";
LAB_00a626c5:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    pcVar6 = "(1, 0, 0, 1)";
LAB_00a62784:
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(__return_storage_ptr__->resultExpected)._M_string_length,
               (ulong)pcVar6);
    pcVar6 = "(0, 0, 0, 1)";
LAB_00a627a2:
    std::__cxx11::string::_M_replace((ulong)psVar9,0,(char *)*psVar8,(ulong)pcVar6);
    pcVar6 = "u";
    goto LAB_00a628fa;
  case 0x8237:
    pcVar6 = "rg8i";
    goto LAB_00a626fe;
  case 0x8238:
    pcVar6 = "rg8ui";
    goto LAB_00a62771;
  case 0x8239:
    pcVar6 = "rg16i";
    goto LAB_00a626fe;
  case 0x823a:
    pcVar6 = "rg16ui";
    goto LAB_00a62771;
  case 0x823b:
    pcVar6 = "rg32i";
LAB_00a626fe:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    pcVar6 = "(1, 1, 0, 1)";
    goto LAB_00a62741;
  case 0x823c:
    pcVar6 = "rg32ui";
LAB_00a62771:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    pcVar6 = "(1, 1, 0, 1)";
    goto LAB_00a62784;
  default:
    if (format != 0x81a5) goto switchD_00a6243a_caseD_8f96;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1a71da2);
    pcVar6 = "(1, 0, 0, 0)";
    goto LAB_00a6282f;
  }
LAB_00a62862:
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
  pcVar6 = "(1, 0, 0, 1)";
LAB_00a62878:
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(__return_storage_ptr__->resultExpected)._M_string_length,
             (ulong)pcVar6);
  pcVar6 = "(0, 0, 0, 1)";
LAB_00a62902:
  std::__cxx11::string::_M_replace((ulong)psVar9,0,(char *)*psVar8,(ulong)pcVar6);
switchD_00a6243a_caseD_8f96:
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_1f8._M_dataplus._M_p,
             local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->returnType,(string *)&local_1a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  std::operator+(&local_238,"u",outputBase);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_198 = *plVar7;
    lStack_190 = plVar4[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar7;
    local_1a8 = (long *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->outputType,(string *)&local_1a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  paVar2 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_238,&local_1f8,inputBase);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_218 = (string *)&__return_storage_ptr__->inputType;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_198 = *plVar7;
    lStack_190 = plVar4[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar7;
    local_1a8 = (long *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_210 = (string *)&__return_storage_ptr__->outputType;
  std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  local_208 = &__return_storage_ptr__->pointType;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)local_208,0,(char *)(__return_storage_ptr__->pointType)._M_string_length,
             0x1c89458);
  local_1d0 = &__return_storage_ptr__->pointDef;
  std::__cxx11::string::_M_replace
            ((ulong)local_1d0,0,(char *)(__return_storage_ptr__->pointDef)._M_string_length,
             0x1ab5ad8);
  iVar3 = std::__cxx11::string::compare((char *)&__return_storage_ptr__->returnType);
  pcVar6 = "0";
  if (iVar3 == 0) {
    pcVar6 = "0.008";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->epsilon,0,
             (char *)(__return_storage_ptr__->epsilon)._M_string_length,(ulong)pcVar6);
  if (local_1d4 < 0x8c18) {
    if (local_1d4 < 0x84f5) {
      if (local_1d4 != 0xde0) {
        if (local_1d4 != 0x806f) goto LAB_00a63994;
        std::operator+(&local_238,"u",outputBase);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_198 = *plVar7;
          lStack_190 = plVar4[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar7;
          local_1a8 = (long *)*plVar4;
        }
        local_1a0 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_238,&local_1f8,inputBase);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        goto LAB_00a6312f;
      }
      std::operator+(&local_238,"u",outputBase);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar4[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar4;
      }
      local_1a0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_238,&local_1f8,inputBase);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_198 = *plVar4;
        lStack_190 = puVar5[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar4;
        local_1a8 = (long *)*puVar5;
      }
      local_1a0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_208,0,(char *)(__return_storage_ptr__->pointType)._M_string_length,
                 0x1c4ccf1);
      pcVar6 = "gl_WorkGroupID.x";
    }
    else {
      if (local_1d4 == 0x84f5) {
        std::operator+(&local_238,&local_1f8,inputBase);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_198 = *plVar7;
          lStack_190 = plVar4[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar7;
          local_1a8 = (long *)*plVar4;
        }
        local_1a0 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        local_1b8[0] = local_238.field_2._M_allocated_capacity;
        local_1c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_238._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p == paVar2) goto LAB_00a63994;
        goto LAB_00a6398c;
      }
      if (local_1d4 != 0x8513) goto LAB_00a63994;
      std::operator+(&local_238,"u",outputBase);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar4[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar4;
      }
      local_1a0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_238,&local_1f8,inputBase);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar4[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar4;
      }
      local_1a0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_208,0,(char *)(__return_storage_ptr__->pointType)._M_string_length,
                 0x1a45ffb);
      pcVar6 = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6";
    }
  }
  else {
    if (local_1d4 < 0x9009) {
      if (local_1d4 == 0x8c18) {
        std::operator+(&local_238,"u",outputBase);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_198 = *plVar7;
          lStack_190 = plVar4[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar7;
          local_1a8 = (long *)*plVar4;
        }
        local_1a0 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_238,&local_1f8,inputBase);
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_198 = *plVar4;
          lStack_190 = puVar5[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar4;
          local_1a8 = (long *)*puVar5;
        }
        local_1a0 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)local_208,0,(char *)(__return_storage_ptr__->pointType)._M_string_length,
                   0x1c89458);
        pcVar6 = "gl_WorkGroupID.x, gl_WorkGroupID.z";
        goto LAB_00a637f4;
      }
      if (local_1d4 != 0x8c1a) goto LAB_00a63994;
      std::operator+(&local_238,"u",outputBase);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar4[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar4;
      }
      local_1a0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_238,&local_1f8,inputBase);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
LAB_00a6312f:
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar4[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar4;
      }
      local_1a0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
      if (local_1a8 != &local_198) goto LAB_00a63196;
    }
    else {
      if (local_1d4 != 0x9009) {
        if (local_1d4 == 0x9100) {
          std::operator+(&local_238,&local_1f8,inputBase);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_198 = *plVar7;
            lStack_190 = plVar4[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *plVar7;
            local_1a8 = (long *)*plVar4;
          }
          local_1a0 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<(&local_1a8,local_1fc);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1a93a90);
        }
        else {
          if (local_1d4 != 0x9102) goto LAB_00a63994;
          std::operator+(&local_238,"u",outputBase);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_198 = *plVar7;
            lStack_190 = plVar4[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *plVar7;
            local_1a8 = (long *)*plVar4;
          }
          local_1a0 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_238,&local_1f8,inputBase);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_198 = *plVar4;
            lStack_190 = puVar5[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *plVar4;
            local_1a8 = (long *)*puVar5;
          }
          local_1a0 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_replace
                    ((ulong)local_208,0,(char *)(__return_storage_ptr__->pointType)._M_string_length
                     ,0x1a45ffb);
          std::__cxx11::string::_M_replace
                    ((ulong)local_1d0,0,(char *)(__return_storage_ptr__->pointDef)._M_string_length,
                     0x1ab5b35);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<(&local_1a8,local_1fc);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1a93a90);
        }
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_238.field_2._M_allocated_capacity = *psVar8;
          local_238.field_2._8_8_ = plVar4[3];
          local_238._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *psVar8;
          local_238._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_238._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->sampleDef,(string *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8[0] ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8) goto LAB_00a63994;
LAB_00a6398c:
        operator_delete(local_1c8[0],local_1b8[0] + 1);
        goto LAB_00a63994;
      }
      std::operator+(&local_238,"u",outputBase);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar4[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar4;
      }
      local_1a0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=(local_210,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_238,&local_1f8,inputBase);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_198 = *plVar4;
        lStack_190 = puVar5[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar4;
        local_1a8 = (long *)*puVar5;
      }
      local_1a0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::operator=(local_218,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
LAB_00a63196:
        operator_delete(local_1a8,local_198 + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)local_208,0,(char *)(__return_storage_ptr__->pointType)._M_string_length,
               0x1a45ffb);
    pcVar6 = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
  }
LAB_00a637f4:
  std::__cxx11::string::_M_replace
            ((ulong)local_1d0,0,(char *)(__return_storage_ptr__->pointDef)._M_string_length,
             (ulong)pcVar6);
LAB_00a63994:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SparseTexture2CommitmentTestCase::TokenStrings SparseTexture2CommitmentTestCase::createShaderTokens(
	GLint target, GLint format, GLint sample, const std::string outputBase, const std::string inputBase)
{
	TokenStrings s;
	std::string  prefix;

	if (format == GL_R8)
	{
		s.format		 = "r8";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R8_SNORM)
	{
		s.format		 = "r8_snorm";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R16)
	{
		s.format		 = "r16";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R16_SNORM)
	{
		s.format		 = "r16_snorm";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG8)
	{
		s.format		 = "rg8";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG8_SNORM)
	{
		s.format		 = "rg8_snorm";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16)
	{
		s.format		 = "rg16";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16_SNORM)
	{
		s.format		 = "rg16_snorm";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA8)
	{
		s.format		 = "rgba8";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGBA8_SNORM)
	{
		s.format		 = "rgba8_snorm";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGB10_A2)
	{
		s.format		 = "rgb10_a2";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGB10_A2UI)
	{
		s.format		 = "rgb10_a2ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA16)
	{
		s.format		 = "rgba16";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGBA16_SNORM)
	{
		s.format		 = "rgba16_snorm";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R16F)
	{
		s.format		 = "r16f";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16F)
	{
		s.format		 = "rg16f";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA16F)
	{
		s.format		 = "rgba16f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R32F)
	{
		s.format		 = "r32f";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG32F)
	{
		s.format		 = "rg32f";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA32F)
	{
		s.format		 = "rgba32f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R11F_G11F_B10F)
	{
		s.format		 = "r11f_g11f_b10f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R8I)
	{
		s.format		 = "r8i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R8UI)
	{
		s.format		 = "r8ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_R16I)
	{
		s.format		 = "r16i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R16UI)
	{
		s.format		 = "r16ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_R32I)
	{
		s.format		 = "r32i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R32UI)
	{
		s.format		 = "r32ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG8I)
	{
		s.format		 = "rg8i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG8UI)
	{
		s.format		 = "rg8ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG16I)
	{
		s.format		 = "rg16i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG16UI)
	{
		s.format		 = "rg16ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG32I)
	{
		s.format		 = "rg32i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG32UI)
	{
		s.format		 = "rg32ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA8I)
	{
		s.format		 = "rgba8i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_RGBA8UI)
	{
		s.format		 = "rgba8ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA16I)
	{
		s.format		 = "rgba16i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_RGBA16UI)
	{
		s.format		 = "rgba16ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA32I)
	{
		s.format		 = "rgba32i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_DEPTH_COMPONENT16)
	{
		s.format		 = "r16";
		s.resultExpected = "(1, 0, 0, 0)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}

	s.returnType = prefix + "vec4";
	s.outputType = "u" + outputBase + "2D";
	s.inputType  = prefix + inputBase + "2D";
	s.pointType  = "ivec2";
	s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y";

	if (s.returnType == "vec4")
		s.epsilon = "0.008";
	else
		s.epsilon = "0";

	if (target == GL_TEXTURE_1D)
	{
		s.outputType = "u" + outputBase + "2D";
		s.inputType  = prefix + inputBase + "1D";
		s.pointType  = "int";
		s.pointDef   = "gl_WorkGroupID.x";
	}
	else if (target == GL_TEXTURE_1D_ARRAY)
	{
		s.outputType = "u" + outputBase + "2D_ARRAY";
		s.inputType  = prefix + inputBase + "1DArray";
		s.pointType  = "ivec2";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "2DArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_3D)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "3D";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "Cube";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6";
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "CubeArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_RECTANGLE)
	{
		s.inputType = prefix + inputBase + "2DRect";
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE)
	{
		s.inputType = prefix + inputBase + "2DMS";
		s.sampleDef = ", " + de::toString(sample);
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "2DMSArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
		s.sampleDef  = ", " + de::toString(sample);
	}

	return s;
}